

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool google::protobuf::anon_unknown_31::IsSubSymbol(StringPiece sub_symbol,StringPiece super_symbol)

{
  int iVar1;
  ulong uVar2;
  char *__s2;
  ulong __n;
  char *__s1;
  size_type len;
  
  uVar2 = super_symbol.length_;
  __s2 = super_symbol.ptr_;
  __n = sub_symbol.length_;
  __s1 = sub_symbol.ptr_;
  if (__n == uVar2) {
    if (__n == 0 || __s1 == __s2) {
      return true;
    }
    iVar1 = bcmp(__s1,__s2,__n);
    if (iVar1 == 0) {
      return true;
    }
  }
  if ((__n <= uVar2) && (iVar1 = bcmp(__s2,__s1,__n), iVar1 == 0)) {
    if (__n < uVar2) {
      return __s2[__n] == '.';
    }
    __assert_fail("i < length_",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringpiece.h"
                  ,0xf3,
                  "char google::protobuf::stringpiece_internal::StringPiece::operator[](size_type) const"
                 );
  }
  return false;
}

Assistant:

bool IsSubSymbol(StringPiece sub_symbol, StringPiece super_symbol) {
  return sub_symbol == super_symbol ||
         (HasPrefixString(super_symbol, sub_symbol) &&
          super_symbol[sub_symbol.size()] == '.');
}